

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardOptions.hpp
# Opt level: O0

void __thiscall
Configurable::DisplayOption<Apple::II::Machine::Options>::declare_display_option
          (DisplayOption<Apple::II::Machine::Options> *this)

{
  allocator<char> local_31;
  string local_30;
  DisplayOption<Apple::II::Machine::Options> *local_10;
  DisplayOption<Apple::II::Machine::Options> *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"output",&local_31);
  Reflection::StructImpl<Apple::II::Machine::Options>::declare<Configurable::Display>
            ((StructImpl<Apple::II::Machine::Options> *)(this + -2),&this->output,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  Reflection::Enum::declare<Configurable::Display>
            ("Display","RGB, SVideo, CompositeColour, CompositeMonochrome");
  return;
}

Assistant:

void declare_display_option() {
			static_cast<Owner *>(this)->declare(&output, "output");
			AnnounceEnumNS(Configurable, Display);
		}